

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CY.hpp
# Opt level: O0

void __thiscall qclab::qgates::CY<std::complex<double>_>::CY(CY<std::complex<double>_> *this)

{
  CY<std::complex<double>_> *this_local;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,0,1);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00759ca0;
  std::make_unique<qclab::qgates::PauliY<std::complex<double>>,int>((int *)&this->gate_);
  return;
}

Assistant:

CY()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliY< T > >( 1 ) )
        { }